

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_setopt(CURLM *multi_handle,CURLMoption option,...)

{
  char **sites;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  char **local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list param;
  CURLMcode res;
  Curl_multi *multi;
  CURLMoption option_local;
  CURLM *multi_handle_local;
  
  sites = local_e8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((multi_handle == (CURLM *)0x0) || (*multi_handle != 0xbab1e)) {
    multi_handle_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    param[0].overflow_arg_area = local_f8;
    param[0]._0_8_ = &stack0x00000008;
    if (option == CURLMOPT_PIPELINING) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(bool *)((long)multi_handle + 0x58) = local_e8 != (char **)0x0;
    }
    else if (option == CURLMOPT_MAXCONNECTS) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0x70) = local_e8;
    }
    else if (option == CURLMOPT_MAX_HOST_CONNECTIONS) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0x78) = local_e8;
    }
    else if (option == CURLMOPT_MAX_PIPELINE_LENGTH) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0x88) = local_e8;
    }
    else if (option == CURLMOPT_MAX_TOTAL_CONNECTIONS) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0x80) = local_e8;
    }
    else if (option == CURLMOPT_SOCKETDATA) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0x38) = local_e8;
    }
    else if (option == CURLMOPT_TIMERDATA) {
      param[0].reg_save_area._4_4_ = CURLM_OK;
      *(char ***)((long)multi_handle + 0xb8) = local_e8;
    }
    else {
      local_e0 = in_RCX;
      local_d8 = in_R8;
      local_d0 = in_R9;
      if (option == CURLMOPT_PIPELINING_SITE_BL) {
        param[0].reg_save_area._4_4_ = 0;
        local_44 = 0x30;
        local_48 = 0x18;
        local_e8 = (char **)in_RDX;
        param[0].reg_save_area._4_4_ =
             Curl_pipeline_set_site_blacklist(sites,(curl_llist **)((long)multi_handle + 0xa0));
      }
      else if (option == CURLMOPT_PIPELINING_SERVER_BL) {
        param[0].reg_save_area._4_4_ = 0;
        local_44 = 0x30;
        local_48 = 0x18;
        local_e8 = (char **)in_RDX;
        param[0].reg_save_area._4_4_ =
             Curl_pipeline_set_server_blacklist(sites,(curl_llist **)((long)multi_handle + 0xa8));
      }
      else if (option == CURLMOPT_SOCKETFUNCTION) {
        param[0].reg_save_area._4_4_ = CURLM_OK;
        *(char ***)((long)multi_handle + 0x30) = local_e8;
      }
      else if (option == CURLMOPT_TIMERFUNCTION) {
        param[0].reg_save_area._4_4_ = CURLM_OK;
        *(char ***)((long)multi_handle + 0xb0) = local_e8;
      }
      else if (option == CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE) {
        param[0].reg_save_area._4_4_ = CURLM_OK;
        *(char ***)((long)multi_handle + 0x90) = local_e8;
      }
      else if (option == CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE) {
        param[0].reg_save_area._4_4_ = CURLM_OK;
        *(char ***)((long)multi_handle + 0x98) = local_e8;
      }
      else {
        param[0].reg_save_area._4_4_ = CURLM_UNKNOWN_OPTION;
      }
    }
    multi_handle_local._4_4_ = param[0].reg_save_area._4_4_;
  }
  return multi_handle_local._4_4_;
}

Assistant:

CURLMcode curl_multi_setopt(CURLM *multi_handle,
                            CURLMoption option, ...)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  CURLMcode res = CURLM_OK;
  va_list param;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->pipelining_enabled = (0 != va_arg(param, long)) ? TRUE : FALSE;
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    multi->maxconnects = va_arg(param, long);
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    multi->max_pipeline_length = va_arg(param, long);
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    multi->content_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    multi->chunk_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    res = Curl_pipeline_set_site_blacklist(va_arg(param, char **),
                                           &multi->pipelining_site_bl);
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    res = Curl_pipeline_set_server_blacklist(va_arg(param, char **),
                                             &multi->pipelining_server_bl);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}